

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

array<float,_3>
pbrt::Mul<pstd::array<float,3>,3,pstd::array<float,3>>(SquareMatrix<3> *m,array<float,_3> *v)

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  undefined1 auVar3 [16];
  array<float,_3> aVar4;
  array<float,_3> result;
  
  result.values[2] = 0.0;
  result.values[0] = 0.0;
  result.values[1] = 0.0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    auVar3 = ZEXT816(0) << 0x40;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)(*(Float (*) [3])*(Float (*) [3])m)[lVar2]),
                               ZEXT416((uint)v->values[lVar2]));
    }
    result.values[lVar1] = auVar3._0_4_;
    m = (SquareMatrix<3> *)((long)m + 0xc);
  }
  aVar4.values[0] = result.values[0];
  aVar4.values[1] = result.values[1];
  aVar4.values[2] = result.values[2];
  return (array<float,_3>)aVar4.values;
}

Assistant:

array() = default;